

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnnvalue * parsevalue(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  char *pcVar2;
  rnnauthor **pprVar3;
  rnnenum **pprVar4;
  xmlNode *local_40;
  xmlNode *chain;
  xmlAttr *attr;
  rnnvalue *val;
  xmlNode *node_local;
  char *file_local;
  rnndb *db_local;
  
  db_local = (rnndb *)calloc(0x68,1);
  db_local->spectypes = (rnnspectype **)file;
  for (chain = (xmlNode *)node->properties; chain != (xmlNode *)0x0; chain = chain->next) {
    iVar1 = strcmp((char *)chain->name,"name");
    if (iVar1 == 0) {
      pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain);
      pcVar2 = strdup(pcVar2);
      *(char **)&db_local->copyright = pcVar2;
    }
    else {
      iVar1 = strcmp((char *)chain->name,"value");
      if (iVar1 == 0) {
        pprVar3 = (rnnauthor **)getnumattrib(db,file,(uint)node->line,(xmlAttr *)chain);
        (db_local->copyright).authors = pprVar3;
        *(undefined4 *)&(db_local->copyright).license = 1;
      }
      else {
        iVar1 = strcmp((char *)chain->name,"varset");
        if (iVar1 == 0) {
          pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain);
          pprVar4 = (rnnenum **)strdup(pcVar2);
          db_local->enums = pprVar4;
        }
        else {
          iVar1 = strcmp((char *)chain->name,"variants");
          if (iVar1 == 0) {
            pcVar2 = getattrib(db,file,(uint)node->line,(xmlAttr *)chain);
            pcVar2 = strdup(pcVar2);
            *(char **)&db_local->enumsnum = pcVar2;
          }
          else {
            fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for value\n",file,(ulong)node->line,
                    chain->name);
            db->estatus = 1;
          }
        }
      }
    }
  }
  for (local_40 = node->children; local_40 != (xmlNode *)0x0; local_40 = local_40->next) {
    if (((local_40->type == XML_ELEMENT_NODE) && (iVar1 = trytop(db,file,local_40), iVar1 == 0)) &&
       (iVar1 = trydoc(db,file,local_40), iVar1 == 0)) {
      fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",file,(ulong)local_40->line,node->name,
              local_40->name);
      db->estatus = 1;
    }
  }
  if (*(long *)&db_local->copyright == 0) {
    fprintf(_stderr,"%s:%d: nameless value\n",file,(ulong)node->line);
    db->estatus = 1;
    db_local = (rnndb *)0x0;
  }
  return (rnnvalue *)db_local;
}

Assistant:

static struct rnnvalue *parsevalue(struct rnndb *db, char *file, xmlNode *node) {
	struct rnnvalue *val = calloc(sizeof *val, 1);
	val->file = file;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			val->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "value")) {
			val->value = getnumattrib(db, file, node->line, attr);
			val->valvalid = 1;
		} else if (!strcmp(attr->name, "varset")) {
			val->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			val->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for value\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!val->name) {
		fprintf (stderr, "%s:%d: nameless value\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
		return val;
	}
}